

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  byte bVar6;
  ushort uVar7;
  DError *paaiVar8;
  ulong uVar9;
  undefined8 uVar10;
  ushort uVar11;
  int iVar12;
  uint32_t uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  uint16_t *puVar21;
  long lVar22;
  VP8MBInfo *pVVar23;
  uint8_t *puVar24;
  int8_t *piVar25;
  uint uVar26;
  long lVar27;
  uint8_t *puVar28;
  ulong uVar29;
  ushort uVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  ushort uVar37;
  char cVar38;
  long lVar39;
  VP8Encoder *pVVar40;
  uint8_t *puVar41;
  VP8ModeScore *rd_00;
  VP8ModeScore *pVVar42;
  long lVar43;
  long lVar44;
  uint16_t *puVar45;
  VP8ModeScore *__src;
  long lVar46;
  ulong uVar47;
  uint8_t *puVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint8_t *local_490;
  long local_480;
  long local_478;
  long lStack_470;
  int local_444;
  long local_440;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  long local_388;
  undefined8 local_360 [64];
  int16_t local_160 [140];
  uint local_48;
  int8_t local_44 [3];
  int8_t local_40 [16];
  
  iVar19 = it->enc_->method_;
  rd->nz = 0;
  rd->D = 0;
  rd->SD = 0;
  rd->H = 0;
  rd->R = 0;
  local_440 = 0x7fffffffffffff;
  rd->score = 0x7fffffffffffff;
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);
  if (rd_opt != RD_OPT_NONE) {
    local_444 = -1;
    it->do_trellis_ = (uint)(RD_OPT_TRELLIS < rd_opt);
    puVar48 = it->yuv_in_;
    pVVar40 = it->enc_;
    uVar26 = *(byte *)it->mb_ >> 5 & 3;
    iVar17 = pVVar40->dqm_[uVar26].lambda_i16_;
    local_478._0_4_ = iVar17;
    iVar18 = pVVar40->dqm_[uVar26].tlambda_;
    iVar12 = IsFlatSource16(puVar48);
    rd->mode_i16 = -1;
    rd_00 = (VP8ModeScore *)local_3a8;
    __src = rd;
    for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
      puVar32 = it->yuv_out2_;
      rd_00->mode_i16 = (int)lVar39;
      uVar13 = ReconstructIntra16(it,rd_00,puVar32,(int)lVar39);
      rd_00->nz = uVar13;
      iVar14 = (*VP8SSE16x16)(puVar48,puVar32);
      rd_00->D = (long)iVar14;
      if (iVar18 == 0) {
        lVar20 = 0;
      }
      else {
        iVar14 = (*VP8TDisto16x16)(puVar48,puVar32,kWeightY);
        lVar20 = (long)(iVar14 * iVar18 + 0x80 >> 8);
      }
      rd_00->SD = lVar20;
      rd_00->H = (ulong)VP8FixedCostsI16[lVar39];
      iVar14 = VP8GetCostLuma16(it,rd_00);
      rd_00->R = (long)iVar14;
      bVar49 = iVar12 != 0;
      iVar12 = 0;
      if ((bVar49) && (iVar14 = IsFlat_C(rd_00->y_ac_levels[0],0x10,0), iVar14 != 0)) {
        rd_00->D = rd_00->D * 2;
        rd_00->SD = rd_00->SD * 2;
        iVar12 = iVar14;
      }
      SetRDScore(iVar17,rd_00);
      if ((lVar39 == 0) || (pVVar42 = rd_00, rd_00->score < __src->score)) {
        uVar1 = it->yuv_out_;
        uVar3 = it->yuv_out2_;
        auVar50._8_4_ = (int)uVar1;
        auVar50._0_8_ = uVar3;
        auVar50._12_4_ = (int)((ulong)uVar1 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar3;
        it->yuv_out2_ = (uint8_t *)auVar50._8_8_;
        pVVar42 = __src;
        __src = rd_00;
      }
      rd_00 = pVVar42;
    }
    if (__src != rd) {
      memcpy(rd,__src,0x370);
    }
    SetRDScore(pVVar40->dqm_[uVar26].lambda_mode_,rd);
    VP8SetIntra16Mode(it,rd->mode_i16);
    if (((rd->nz & 0x100ffff) == 0x1000000) && ((long)pVVar40->dqm_[uVar26].min_disto_ < rd->D)) {
      uVar11 = rd->y_dc_levels[1];
      uVar7 = rd->y_dc_levels[2];
      uVar30 = -uVar11;
      if (0 < (short)uVar11) {
        uVar30 = uVar11;
      }
      uVar11 = -uVar7;
      if (0 < (short)uVar7) {
        uVar11 = uVar7;
      }
      uVar7 = rd->y_dc_levels[4];
      uVar37 = -uVar7;
      if (0 < (short)uVar7) {
        uVar37 = uVar7;
      }
      if (uVar30 < uVar11) {
        uVar30 = uVar11;
      }
      if (uVar37 <= uVar30) {
        uVar37 = uVar30;
      }
      if (pVVar40->dqm_[uVar26].max_edge_ < (int)(uint)uVar37) {
        pVVar40->dqm_[uVar26].max_edge_ = (uint)uVar37;
      }
    }
    pVVar40 = it->enc_;
    pVVar23 = it->mb_;
    puVar48 = it->yuv_in_;
    puVar32 = it->yuv_out2_;
    if (1 < iVar19) {
      if (pVVar40->max_i4_header_bits_ != 0) {
        uVar26 = *(byte *)pVVar23 >> 5 & 3;
        lVar39 = (long)pVVar40->dqm_[uVar26].lambda_i4_;
        iVar19 = pVVar40->dqm_[uVar26].tlambda_;
        local_48 = 0;
        local_3a8 = (undefined1  [16])0x0;
        local_398 = ZEXT816(0xd3);
        local_388 = (long)pVVar40->dqm_[uVar26].lambda_mode_ * 0xd3;
        VP8IteratorStartI4(it);
        puVar31 = rd->modes_i4;
        iVar17 = 0;
        do {
          uVar11 = VP8Scan[it->i4_];
          puVar41 = puVar48 + uVar11;
          puVar21 = GetCostModeI4(it,puVar31);
          local_490 = it->yuv_p_ + 0x688;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          lVar33 = 0;
          local_478 = 0x7fffffffffffff;
          uVar34 = 0;
          uVar35 = 0;
          lVar36 = 0;
          lVar20 = 0;
          iVar18 = -1;
          puVar24 = puVar32 + uVar11;
          for (lVar43 = 0; lVar43 != 10; lVar43 = lVar43 + 1) {
            iVar14 = ReconstructIntra4(it,(int16_t *)&local_3c8,puVar41,local_490,(int)lVar43);
            iVar12 = it->i4_;
            iVar15 = (*VP8SSE4x4)(puVar41,local_490);
            if (iVar19 == 0) {
              lVar27 = 0;
            }
            else {
              iVar16 = (*VP8TDisto4x4)(puVar41,local_490,kWeightY);
              lVar27 = (long)(iVar16 * iVar19 + 0x80 >> 8);
            }
            uVar47 = (ulong)puVar21[lVar43];
            if (lVar43 == 0) {
LAB_0015c745:
              lVar44 = 0;
            }
            else {
              iVar16 = IsFlat_C((int16_t *)&local_3c8,1,3);
              lVar44 = 0x8c;
              if (iVar16 == 0) goto LAB_0015c745;
            }
            lVar46 = (lVar27 + iVar15) * 0x100;
            lVar22 = local_478;
            puVar28 = puVar24;
            if ((iVar18 < 0) || ((long)((lVar44 + uVar47) * lVar39 + lVar46) < local_478)) {
              iVar16 = VP8GetCostLuma4(it,(int16_t *)&local_3c8);
              lVar46 = (lVar44 + iVar16 + uVar47) * lVar39 + lVar46;
              if ((iVar18 < 0) || (lVar46 < local_478)) {
                lVar20 = (long)it->i4_;
                local_360[lVar20 * 4 + 2] = local_3b8;
                local_360[lVar20 * 4 + 3] = uStack_3b0;
                local_360[lVar20 * 4] = local_3c8;
                local_360[lVar20 * 4 + 1] = uStack_3c0;
                lVar22 = lVar46;
                puVar28 = local_490;
                local_490 = puVar24;
                lVar20 = (long)iVar15;
                lVar36 = lVar27;
                uVar35 = uVar47;
                lVar33 = lVar44 + iVar16;
                uVar34 = iVar14 << ((byte)iVar12 & 0x1f);
                iVar18 = (int)lVar43;
              }
            }
            local_478 = lVar22;
            puVar24 = puVar28;
          }
          local_3a8._8_8_ = local_3a8._8_8_ + lVar36;
          local_3a8._0_8_ = local_3a8._0_8_ + lVar20;
          local_398._8_8_ = local_398._8_8_ + lVar33;
          local_398._0_8_ = local_398._0_8_ + uVar35;
          local_48 = local_48 | uVar34;
          local_388 = (lVar20 + lVar36) * 0x100 +
                      (uVar35 + lVar33) * (long)pVVar40->dqm_[uVar26].lambda_mode_ + local_388;
          if ((rd->score <= local_388) ||
             (iVar17 = iVar17 + (int)uVar35, pVVar40->max_i4_header_bits_ < iVar17)) {
            puVar32 = it->yuv_out2_;
            goto LAB_0015cb01;
          }
          iVar12 = it->i4_;
          lVar20 = (long)iVar12;
          if (puVar24 != puVar32 + VP8Scan[lVar20]) {
            (*VP8Copy4x4)(puVar24,puVar32 + VP8Scan[lVar20]);
            iVar12 = it->i4_;
            lVar20 = (long)iVar12;
          }
          puVar31[lVar20] = (uint8_t)iVar18;
          it->left_nz_[iVar12 >> 2] = (uint)(uVar34 != 0);
          it->top_nz_[it->i4_ & 3] = (uint)(uVar34 != 0);
          iVar18 = VP8IteratorRotateI4(it,puVar32);
        } while (iVar18 != 0);
        rd->D = local_3a8._0_8_;
        rd->SD = local_3a8._8_8_;
        rd->H = local_398._0_8_;
        rd->R = local_398._8_8_;
        rd->nz = local_48;
        rd->score = local_388;
        VP8SetIntra4Mode(it,puVar31);
        puVar32 = it->yuv_out_;
        it->yuv_out_ = it->yuv_out2_;
        it->yuv_out2_ = puVar32;
        memcpy(rd->y_ac_levels,local_360,0x200);
      }
LAB_0015cb01:
      puVar48 = it->yuv_in_;
      pVVar40 = it->enc_;
      pVVar23 = it->mb_;
    }
    iVar19 = pVVar40->dqm_[*(byte *)pVVar23 >> 5 & 3].lambda_uv_;
    puVar41 = it->yuv_out_ + 0x10;
    rd->mode_uv = -1;
    local_478 = 0;
    lStack_470 = 0;
    lVar20 = 0;
    uVar26 = 0;
    lVar39 = 0;
    puVar32 = puVar32 + 0x10;
    puVar31 = puVar41;
    for (lVar36 = 0; iVar17 = (int)lVar36, lVar36 != 4; lVar36 = lVar36 + 1) {
      local_48 = ReconstructUV(it,(VP8ModeScore *)local_3a8,puVar32,iVar17);
      iVar18 = (*VP8SSE16x8)(puVar48 + 0x10,puVar32);
      auVar50 = local_398;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = (long)iVar18;
      local_398._2_6_ = 0;
      local_398._0_2_ = VP8FixedCostsUV[lVar36];
      local_398._8_8_ = auVar50._8_8_;
      iVar18 = VP8GetCostUV(it,(VP8ModeScore *)local_3a8);
      lVar33 = (long)iVar18;
      local_398._8_8_ = lVar33;
      if (lVar36 != 0) {
        iVar18 = IsFlat_C(local_160,8,2);
        if (iVar18 != 0) {
          lVar33 = lVar33 + 0x460;
        }
      }
      uVar34 = local_48;
      uVar10 = local_398._0_8_;
      lVar43 = (local_3a8._8_8_ + local_3a8._0_8_) * 0x100 +
               (local_398._0_8_ + lVar33) * (long)iVar19;
      if ((lVar36 == 0) || (puVar24 = puVar31, lVar43 < local_440)) {
        local_478 = local_3a8._0_8_;
        lStack_470 = local_3a8._8_8_;
        rd->mode_uv = iVar17;
        memcpy(rd->uv_levels,local_160,0x100);
        puVar24 = puVar32;
        puVar32 = puVar31;
        lVar39 = lVar33;
        local_440 = lVar43;
        lVar20 = uVar10;
        local_444 = iVar17;
        uVar26 = uVar34;
        if (it->top_derr_ != (DError *)0x0) {
          *(undefined2 *)(rd->derr[1] + 1) = local_40._0_2_;
          *(undefined4 *)rd->derr = _local_44;
        }
      }
      puVar31 = puVar24;
    }
    VP8SetIntraUVMode(it,local_444);
    rd->D = rd->D + local_478;
    rd->SD = rd->SD + lStack_470;
    rd->R = rd->R + lVar39;
    rd->H = rd->H + lVar20;
    rd->nz = rd->nz | uVar26;
    rd->score = rd->score + local_440;
    if (puVar31 != puVar41) {
      (*VP8Copy16x8)(puVar31,puVar41);
    }
    if (it->top_derr_ != (DError *)0x0) {
      iVar19 = it->x_;
      piVar25 = rd->derr[0] + 2;
      for (lVar39 = 0; lVar39 != 2; lVar39 = lVar39 + 1) {
        paaiVar8 = it->top_derr_;
        it->left_derr_[lVar39][0] = (*(int8_t (*) [3])(piVar25 + -2))[0];
        cVar5 = *piVar25;
        cVar38 = (char)((uint)(cVar5 * 3) >> 2);
        it->left_derr_[lVar39][1] = cVar38;
        paaiVar8[iVar19][lVar39][0] = piVar25[-1];
        paaiVar8[iVar19][lVar39][1] = cVar5 - cVar38;
        piVar25 = piVar25 + 3;
      }
    }
    if (rd_opt == RD_OPT_TRELLIS) {
      it->do_trellis_ = 1;
      if (((uint)*it->mb_ & 3) == 1) {
        uVar34 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
      }
      else {
        pVVar40 = it->enc_;
        VP8IteratorStartI4(it);
        uVar34 = 0;
        do {
          uVar26 = it->i4_;
          uVar11 = VP8Scan[(int)uVar26];
          bVar6 = it->preds_[(int)(((int)uVar26 >> 2) * pVVar40->preds_w_ + (uVar26 & 3))];
          puVar48 = it->yuv_in_;
          puVar32 = it->yuv_out_;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          iVar19 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar48 + uVar11,puVar32 + uVar11,
                                     (uint)bVar6);
          uVar34 = uVar34 | iVar19 << ((byte)it->i4_ & 0x1f);
          iVar19 = VP8IteratorRotateI4(it,it->yuv_out_);
        } while (iVar19 != 0);
      }
      uVar26 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
      uVar26 = uVar26 | uVar34;
      rd->nz = uVar26;
    }
    else {
      uVar26 = rd->nz;
    }
    goto LAB_0015d1cc;
  }
  local_480 = it->enc_->dqm_[*(byte *)it->mb_ >> 5 & 3].i4_penalty_;
  bVar49 = 1 < iVar19;
  if (iVar19 < 2) {
    local_478 = 0x7fffffffffffff;
    local_490 = (uint8_t *)0x7fffffffffffff;
    if ((*(byte *)it->mb_ & 3) == 1) goto LAB_0015ca3b;
LAB_0015cf64:
    VP8IteratorStartI4(it);
    puVar48 = rd->modes_i4;
    lVar39 = 0;
    uVar34 = 0;
    do {
      uVar11 = VP8Scan[it->i4_];
      puVar32 = it->yuv_in_;
      puVar21 = GetCostModeI4(it,puVar48);
      (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
      puVar45 = VP8I4ModeOffsets;
      uVar35 = 0xffffffffffffffff;
      lVar20 = 0x7fffffffffffff;
      for (uVar47 = 0; uVar47 != 10; uVar47 = uVar47 + 1) {
        iVar17 = (*VP8SSE4x4)(puVar32 + uVar11,it->yuv_p_ + *puVar45);
        lVar36 = (ulong)puVar21[uVar47] * 0xb + (long)iVar17 * 0x100;
        if (lVar36 < lVar20) {
          uVar35 = uVar47;
        }
        uVar35 = uVar35 & 0xffffffff;
        if (lVar36 <= lVar20) {
          lVar20 = lVar36;
        }
        puVar45 = puVar45 + 1;
      }
      uVar7 = puVar21[(int)uVar35];
      iVar17 = it->i4_;
      puVar48[iVar17] = (uint8_t)uVar35;
      local_480 = local_480 + lVar20;
      if (((long)local_490 <= local_480) || (lVar39 = lVar39 + (ulong)uVar7, local_478 < lVar39))
      goto LAB_0015d0e1;
      iVar17 = ReconstructIntra4(it,rd->y_ac_levels[iVar17],puVar32 + uVar11,
                                 it->yuv_out2_ + VP8Scan[iVar17],(int)uVar35);
      uVar34 = uVar34 | iVar17 << ((byte)it->i4_ & 0x1f);
      iVar17 = VP8IteratorRotateI4(it,it->yuv_out2_);
    } while (iVar17 != 0);
    VP8SetIntra4Mode(it,puVar48);
    uVar2 = it->yuv_out_;
    uVar4 = it->yuv_out2_;
    auVar51._8_4_ = (int)uVar2;
    auVar51._0_8_ = uVar4;
    auVar51._12_4_ = (int)((ulong)uVar2 >> 0x20);
    it->yuv_out_ = (uint8_t *)uVar4;
    it->yuv_out2_ = (uint8_t *)auVar51._8_8_;
  }
  else {
    local_478 = (long)it->enc_->mb_header_limit_;
LAB_0015ca3b:
    puVar48 = it->yuv_in_;
    puVar32 = it->yuv_p_;
    uVar35 = 0xffffffffffffffff;
    puVar21 = VP8I16ModeOffsets;
    local_490 = (uint8_t *)0x7fffffffffffff;
    for (uVar47 = 0; iVar17 = (int)uVar35, uVar47 != 4; uVar47 = uVar47 + 1) {
      iVar17 = (*VP8SSE16x16)(puVar48,puVar32 + *puVar21);
      uVar29 = (ulong)VP8FixedCostsI16[uVar47];
      puVar31 = (uint8_t *)(uVar29 * 0x6a + (long)iVar17 * 0x100);
      uVar9 = uVar47;
      if ((long)local_490 <= (long)puVar31) {
        puVar31 = local_490;
        uVar9 = uVar35;
      }
      if (uVar47 == 0 || (long)uVar29 <= local_478) {
        uVar35 = uVar9;
      }
      uVar35 = uVar35 & 0xffffffff;
      if (uVar47 == 0 || (long)uVar29 <= local_478) {
        local_490 = puVar31;
      }
      puVar21 = puVar21 + 1;
    }
    iVar18 = 0;
    if (it->x_ == 0) {
LAB_0015cf35:
      iVar12 = IsFlatSource16(puVar48);
      if (iVar12 != 0) {
        bVar49 = false;
        iVar17 = iVar18;
      }
    }
    else if (it->y_ == 0) {
      iVar18 = 2;
      goto LAB_0015cf35;
    }
    VP8SetIntra16Mode(it,iVar17);
    if (bVar49) goto LAB_0015cf64;
LAB_0015d0e1:
    uVar34 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
    local_480 = (long)local_490;
  }
  if (0 < iVar19) {
    puVar48 = it->yuv_in_;
    uVar35 = 0xffffffffffffffff;
    puVar21 = VP8UVModeOffsets;
    for (uVar47 = 0; uVar47 != 4; uVar47 = uVar47 + 1) {
      iVar19 = (*VP8SSE16x8)(puVar48 + 0x10,it->yuv_p_ + *puVar21);
      lVar39 = (ulong)VP8FixedCostsUV[uVar47] * 0x78 + (long)iVar19 * 0x100;
      if (lVar39 < local_440) {
        uVar35 = uVar47;
      }
      uVar35 = uVar35 & 0xffffffff;
      if (lVar39 <= local_440) {
        local_440 = lVar39;
      }
      puVar21 = puVar21 + 1;
    }
    VP8SetIntraUVMode(it,(int)uVar35);
  }
  uVar26 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
  uVar26 = uVar26 | uVar34;
  rd->nz = uVar26;
  rd->score = local_480;
LAB_0015d1cc:
  VP8SetSkip(it,(uint)(uVar26 == 0));
  return (uint)(uVar26 == 0);
}

Assistant:

int VP8Decimate(VP8EncIterator* WEBP_RESTRICT const it,
                VP8ModeScore* WEBP_RESTRICT const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc_->method_;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis_ = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis_ = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}